

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O0

void __thiscall WasmCGen::Call(WasmCGen *this)

{
  size_type sVar1;
  reference pvVar2;
  ulong __n;
  string local_80;
  ulong local_50;
  size_t i;
  string call;
  size_t param_count;
  w3Function *function;
  size_t function_index;
  WasmCGen *this_local;
  
  printf("/*%s*/\n","Call");
  __n = (ulong)(((this->super_w3SourceGen).super_Wasm.instr)->super_w3DecodedInstructionZeroInit).
               field_0.u32;
  sVar1 = std::vector<w3Function,_std::allocator<w3Function>_>::size(&this->module->functions);
  if (sVar1 <= __n) {
    AssertFailed("function_index < module->functions.size ()");
  }
  pvVar2 = std::vector<w3Function,_std::allocator<w3Function>_>::operator[]
                     (&this->module->functions,__n);
  pvVar2->function_index = __n;
  call.field_2._8_8_ = pvVar2->param_count;
  StringFormat_abi_cxx11_((string *)&i,"function%d(",__n);
  for (local_50 = 0; local_50 < (ulong)call.field_2._8_8_; local_50 = local_50 + 1) {
    if (local_50 != call.field_2._8_8_ - 1) {
      std::__cxx11::string::operator+=((string *)&i,",");
    }
    w3SourceGen::pop_abi_cxx11_(&local_80,&this->super_w3SourceGen);
    std::__cxx11::string::operator+=((string *)&i,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::__cxx11::string::operator+=((string *)&i,")");
  w3SourceGen::push(&this->super_w3SourceGen,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  return;
}

Assistant:

CGEN (Call)
{
    printf ("/*%s*/\n", __func__);

    // FIXME In the instruction table
    const size_t function_index = instr->u32;
    Assert (function_index < module->functions.size ());
    w3Function* function = &module->functions [function_index];
    function->function_index = function_index; // TODO remove this

    size_t param_count = function->param_count;

    string call = StringFormat("function%d(", (int)function_index);

    // todo of course this might be backwards

    for (size_t i = 0; i < param_count; ++i)
    {
        if (i != param_count - 1)
            call += ",";
        call += pop ();
    }
    call += ")";
    push (call);
}